

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bid_fx_exception_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::exceptions::BidFXExceptionTest_test_what_works_Test::TestBody
          (BidFXExceptionTest_test_what_works_Test *this)

{
  BidFXException *this_00;
  AssertionResult gtest_ar;
  BidFXException *e;
  allocator<char> local_31;
  string local_30 [32];
  BidFXExceptionTest_test_what_works_Test *local_10;
  BidFXExceptionTest_test_what_works_Test *this_local;
  
  local_10 = this;
  this_00 = (BidFXException *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"exception what message works",&local_31);
  bidfx_public_api::exceptions::BidFXException::BidFXException(this_00,local_30);
  __cxa_throw(this_00,&BidFXException::typeinfo,BidFXException::~BidFXException);
}

Assistant:

TEST(BidFXExceptionTest, test_what_works)
{
    try
    {
        throw BidFXException("exception what message works");
    }
    catch (BidFXException& e)
    {
        EXPECT_STREQ("exception what message works", e.what());
    }

}